

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sscep.c
# Opt level: O3

void usage(void)

{
  fprintf(_stdout,"\nsscep version %s\n\n","0.10.0");
  fprintf(_stdout,
          "Usage: %s OPERATION [OPTIONS]\n\nAvailable OPERATIONs are\n  getca             Get CA/RA certificate(s)\n  getnextca         Get next CA/RA certificate(s)\n  enroll            Enroll certificate\n  getcert           Query certificate\n  getcrl            Query CRL\n  getcaps           Query SCEP capabilities\n\nGeneral OPTIONS\n  -u <url>          SCEP server URL\n  -p <host:port>    Use proxy server at host:port\n  -M <string>       Monitor Information String name=value&name=value ...\n  -h                Keyforme=ID. \n  -f <file>         Use configuration file\n  -c <file>         CA certificate file or \'-n\' suffixed files (write if OPERATION is getca)\n  -E <name>         PKCS#7 encryption algorithm (des|3des|blowfish|aes[128]|aes192|aes256)\n  -S <name>         PKCS#7 signature algorithm (md5|sha1|sha224|sha256|sha384|sha512)\n  -W <secs>         Wait for connectivity, up to <secs> seconds\n  -v                Verbose output (for debugging the configuration)\n  -d                Debug output (more verbose, for debugging the implementation)\n\nOPTIONS for OPERATION getca are\n  -i <string>       CA identifier string\n  -F <name>         Fingerprint algorithm (md5|sha1|sha224|sha256|sha384|sha512)\n\nOPTIONS for OPERATION getnextca are\n  -C <file>         Local certificate chain file for signature verification in PEM format \n  -F <name>         Fingerprint algorithm (md5|sha1|sha224|sha256|sha384|sha512)\n  -c <file>         CA certificate file (write if OPERATION is getca or getnextca)\n  -w <file>         Write signer certificate in file (optional) \n\nOPTIONS for OPERATION enroll are\n  -k <file>         Private key file\n  -r <file>         Certificate request file\n  -K <file>         Signature private key file, use with -O\n  -O <file>         Signature certificate (used instead of self-signed)\n  -l <file>         Write enrolled certificate in file\n  -e <file>         Use different CA cert for encryption\n  -L <file>         Write selfsigned certificate in file\n  -t <secs>         Polling interval in seconds\n  -T <secs>         Max polling..." /* TRUNCATED STRING LITERAL */
          ,pname);
  exit(0);
}

Assistant:

void
usage() {
	fprintf(stdout, "\nsscep version %s\n\n" , VERSION);
	fprintf(stdout, "Usage: %s OPERATION [OPTIONS]\n"
	"\nAvailable OPERATIONs are\n"
	"  getca             Get CA/RA certificate(s)\n"
	"  getnextca         Get next CA/RA certificate(s)\n"
	"  enroll            Enroll certificate\n"
	"  getcert           Query certificate\n"
	"  getcrl            Query CRL\n"
	"  getcaps           Query SCEP capabilities\n"
	"\nGeneral OPTIONS\n"
	"  -u <url>          SCEP server URL\n"
	"  -p <host:port>    Use proxy server at host:port\n"
	"  -M <string>       Monitor Information String name=value&name=value ...\n"
#ifdef WITH_ENGINES
	"  -g <engine>       Use the given cryptographic engine\n"
#endif
	"  -h                Keyforme=ID. \n"//TODO
	"  -f <file>         Use configuration file\n"
	"  -c <file>         CA certificate file or '-n' suffixed files (write if OPERATION is getca)\n"
	"  -E <name>         PKCS#7 encryption algorithm (des|3des|blowfish|aes[128]|aes192|aes256)\n"
	"  -S <name>         PKCS#7 signature algorithm (md5|sha1|sha224|sha256|sha384|sha512)\n"
	"  -W <secs>         Wait for connectivity, up to <secs> seconds\n"
	"  -v                Verbose output (for debugging the configuration)\n"
	"  -d                Debug output (more verbose, for debugging the implementation)\n"
	"\nOPTIONS for OPERATION getca are\n"
	"  -i <string>       CA identifier string\n"
	"  -F <name>         Fingerprint algorithm (md5|sha1|sha224|sha256|sha384|sha512)\n"
	"\nOPTIONS for OPERATION getnextca are\n"
	"  -C <file>         Local certificate chain file for signature verification in PEM format \n"
	"  -F <name>         Fingerprint algorithm (md5|sha1|sha224|sha256|sha384|sha512)\n"
	"  -c <file>         CA certificate file (write if OPERATION is getca or getnextca)\n"
	"  -w <file>         Write signer certificate in file (optional) \n"
	"\nOPTIONS for OPERATION enroll are\n"
	"  -k <file>         Private key file\n"
	"  -r <file>         Certificate request file\n"
	"  -K <file>         Signature private key file, use with -O\n"
	"  -O <file>         Signature certificate (used instead of self-signed)\n"
	"  -l <file>         Write enrolled certificate in file\n"
	"  -e <file>         Use different CA cert for encryption\n"
	"  -L <file>         Write selfsigned certificate in file\n"
	"  -t <secs>         Polling interval in seconds\n"
	"  -T <secs>         Max polling time in seconds\n"
	"  -n <count>        Max number of GetCertInitial requests\n"
	"  -R                Resume interrupted enrollment\n"
	"\nOPTIONS for OPERATION getcert are\n"
	"  -k <file>         Signature private key file\n"
	"  -l <file>         Signature local certificate file\n"
	"  -O <file>         Issuer Certificate of the certificate to query (requires -s)\n"
	"  -s <number>       Certificate serial number (decimal)\n"
	"  -w <file>         Write certificate in file\n"
	"\nOPTIONS for OPERATION getcrl are\n"
	"  -k <file>         Signature private key file\n"
	"  -l <file>         Signature local certificate file\n"
	"  -O <file>         Certificate to get the CRL for (reads issuer and serial)\n"
	"  -s <number>       Certificate serial number (decimal)\n"
	"  -w <file>         Write CRL in file\n\n", pname);
	exit(0);
}